

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O0

LPWSTR GetEnvironmentStringsW(void)

{
  int iVar1;
  LPWSTR pWVar2;
  int local_24;
  int envNum;
  int len;
  int i;
  WCHAR *tempEnviron;
  WCHAR *wenviron;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  PALCEnterCriticalSection(&gcsEnvironment);
  local_24 = 0;
  for (envNum = 0; palEnvironment[envNum] != (char *)0x0; envNum = envNum + 1) {
    iVar1 = MultiByteToWideChar(0,0,palEnvironment[envNum],-1,(LPWSTR)0x0,0);
    local_24 = iVar1 + local_24;
  }
  pWVar2 = (LPWSTR)PAL_malloc((long)(local_24 + 1) << 1);
  if (pWVar2 == (LPWSTR)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    SetLastError(8);
  }
  else {
    _len = pWVar2;
    for (envNum = 0; palEnvironment[envNum] != (char *)0x0; envNum = envNum + 1) {
      iVar1 = MultiByteToWideChar(0,0,palEnvironment[envNum],-1,_len,local_24);
      _len = _len + iVar1;
      local_24 = local_24 - iVar1;
    }
    *_len = L'\0';
  }
  PALCLeaveCriticalSection(&gcsEnvironment);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return pWVar2;
}

Assistant:

LPWSTR
PALAPI
GetEnvironmentStringsW(
               VOID)
{
    WCHAR *wenviron = NULL, *tempEnviron;
    int i, len, envNum;

    PERF_ENTRY(GetEnvironmentStringsW);
    ENTRY("GetEnvironmentStringsW()\n");

    PALCEnterCriticalSection(&gcsEnvironment);    

    envNum = 0;
    len    = 0;

    /* get total length of the bytes that we need to allocate */
    for (i = 0; palEnvironment[i] != 0; i++)
    {
        len = MultiByteToWideChar(CP_ACP, 0, palEnvironment[i], -1, wenviron, 0);
        envNum += len;
    }

    wenviron = (WCHAR *)PAL_malloc(sizeof(WCHAR)* (envNum + 1));
    if (wenviron == NULL) 
    {
        ERROR("malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto EXIT;
    }

    len = 0;
    tempEnviron = wenviron;
    for (i = 0; palEnvironment[i] != 0; i++)
    {
        len = MultiByteToWideChar(CP_ACP, 0, palEnvironment[i], -1, tempEnviron, envNum);
        tempEnviron += len;
        envNum      -= len;
    }

    *tempEnviron = 0; /* Put an extra NULL at the end */
    
 EXIT:
    PALCLeaveCriticalSection(&gcsEnvironment);

    LOGEXIT("GetEnvironmentStringsW returning %p\n", wenviron);
    PERF_EXIT(GetEnvironmentStringsW);
    return wenviron;
}